

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFunc.cpp
# Opt level: O1

void __thiscall
OpenMD::LegendreCorrFunc::LegendreCorrFunc
          (LegendreCorrFunc *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          int seleOffset,int order)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  string paramString;
  stringstream params;
  undefined1 local_200 [40];
  long *local_1d8;
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  ObjectACF<OpenMD::Vector3<double>_>::ObjectACF
            (&this->super_ObjectACF<OpenMD::Vector3<double>_>,info,filename,sele1,sele2);
  (this->super_ObjectACF<OpenMD::Vector3<double>_>).super_AutoCorrFunc<OpenMD::Vector3<double>_>.
  super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty._vptr_DynamicProperty =
       (_func_int **)&PTR__LegendreCorrFunc_002f4608;
  this->order_ = order;
  p_Var1 = &(this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rotMats_).
  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rotMats_).
  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rotMats_).
  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vectors_).
  super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vectors_).
  super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vectors_).
  super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->doOffset_ = true;
  this->seleOffset_ = seleOffset;
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"Legendre Correlation Function","");
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.corrFuncType_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  getPrefix((string *)local_200,
            &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
             super_AutoCorrFunc<OpenMD::Vector3<double>_>.
             super_TimeCorrFunc<OpenMD::Vector3<double>_>.dumpFilename_);
  plVar3 = (long *)std::__cxx11::string::append(local_200);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_1a8 = *plVar4;
    lStack_1a0 = plVar3[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar4;
    local_1b8 = (long *)*plVar3;
  }
  local_1b0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty.outputFilename_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  pcVar2 = local_200 + 0x10;
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," order = ",9);
  std::ostream::operator<<((ostream *)&local_1a8,this->order_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," seleoffset = ",0xe);
  std::ostream::operator<<((ostream *)&local_1a8,this->seleOffset_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.paramString_);
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"Pn(costheta_x)\tPn(costheta_y)\tPn(costheta_z)","");
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.labelString_);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  LegendrePolynomial::LegendrePolynomial((LegendrePolynomial *)local_200,order);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)&this->legendre_,
              (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)(local_200._8_8_ + (long)order * 0x30));
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::resize(&this->vectors_,
           (long)(this->super_ObjectACF<OpenMD::Vector3<double>_>).
                 super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                 super_TimeCorrFunc<OpenMD::Vector3<double>_>.nFrames_);
  local_200._0_8_ = &PTR__LegendrePolynomial_002fa798;
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::~vector
            ((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
             (local_200 + 8));
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

LegendreCorrFunc::LegendreCorrFunc(SimInfo* info, const std::string& filename,
                                     const std::string& sele1,
                                     const std::string& sele2,
				     int seleOffset,
				     int order) :
    ObjectACF<Vector3d>(info, filename, sele1, sele2), doOffset_(true),
    seleOffset_(seleOffset), order_(order) {
    setCorrFuncType("Legendre Correlation Function");
    setOutputName(getPrefix(dumpFilename_) + ".lcorr");

    std::stringstream params;
    params << " order = " << order_;
    params << " seleoffset = " << seleOffset_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    setLabelString("Pn(costheta_x)\tPn(costheta_y)\tPn(costheta_z)");

    LegendrePolynomial polynomial(order);
    legendre_ = polynomial.getLegendrePolynomial(order);

    vectors_.resize(nFrames_);
  }